

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O3

void VP8YuvToArgb32_SSE2(uint8_t *y,uint8_t *u,uint8_t *v,uint8_t *dst)

{
  uint8_t *puVar1;
  char cVar2;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [14];
  undefined1 auVar23 [12];
  unkbyte10 Var24;
  uint3 uVar25;
  unkbyte9 Var26;
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  uint5 uVar33;
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [14];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  ulong uVar45;
  ushort uVar46;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  undefined1 auVar47 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined2 uVar67;
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined4 uVar68;
  undefined6 uVar69;
  undefined8 uVar70;
  undefined1 auVar71 [12];
  undefined1 auVar72 [14];
  undefined1 auVar74 [16];
  
  auVar44 = _DAT_0014a8f0;
  auVar43 = _DAT_0014a8e0;
  auVar42 = _DAT_0014a8c0;
  auVar41 = _DAT_0014a8b0;
  auVar40 = _DAT_0014a890;
  auVar39 = _DAT_0014a880;
  uVar45 = 0xfffffffffffffff8;
  do {
    uVar70 = *(undefined8 *)(y + uVar45 + 8);
    auVar27[10] = 0;
    auVar27._0_10_ = SUB1610((undefined1  [16])0x0,0);
    auVar27[0xb] = (char)((ulong)uVar70 >> 0x28);
    auVar30[9] = (char)((ulong)uVar70 >> 0x20);
    auVar30._0_9_ = SUB169((undefined1  [16])0x0,0);
    auVar30._10_2_ = auVar27._10_2_;
    auVar34._9_3_ = auVar30._9_3_;
    auVar34._0_9_ = (unkuint9)0;
    auVar75._1_10_ =
         SUB1610(ZEXT516(CONCAT41(auVar34._8_4_,(char)((ulong)uVar70 >> 0x18))) << 0x38,6);
    auVar75[0] = (char)((ulong)uVar70 >> 0x10);
    auVar75._11_5_ = 0;
    auVar65._1_12_ = SUB1612(auVar75 << 0x28,4);
    auVar65[0] = (char)((ulong)uVar70 >> 8);
    auVar65._13_3_ = 0;
    auVar58._1_14_ = SUB1614(auVar65 << 0x18,2);
    auVar58[0] = (char)uVar70;
    auVar58[0xf] = 0;
    auVar65 = pmulhuw(auVar58 << 8,auVar39);
    uVar70 = *(undefined8 *)(u + uVar45 + 8);
    auVar28[10] = 0;
    auVar28._0_10_ = SUB1610((undefined1  [16])0x0,0);
    auVar28[0xb] = (char)((ulong)uVar70 >> 0x28);
    auVar31[9] = (char)((ulong)uVar70 >> 0x20);
    auVar31._0_9_ = SUB169((undefined1  [16])0x0,0);
    auVar31._10_2_ = auVar28._10_2_;
    auVar35._9_3_ = auVar31._9_3_;
    auVar35._0_9_ = (unkuint9)0;
    auVar19._1_10_ =
         SUB1610(ZEXT516(CONCAT41(auVar35._8_4_,(char)((ulong)uVar70 >> 0x18))) << 0x38,6);
    auVar19[0] = (char)((ulong)uVar70 >> 0x10);
    auVar19._11_5_ = 0;
    auVar18._1_12_ = SUB1612(auVar19 << 0x28,4);
    auVar18[0] = (char)((ulong)uVar70 >> 8);
    auVar18._13_3_ = 0;
    auVar60._1_14_ = SUB1614(auVar18 << 0x18,2);
    auVar60[0] = (char)uVar70;
    auVar60[0xf] = 0;
    uVar70 = *(undefined8 *)(v + uVar45 + 8);
    auVar29[10] = 0;
    auVar29._0_10_ = SUB1610((undefined1  [16])0x0,0);
    auVar29[0xb] = (char)((ulong)uVar70 >> 0x28);
    auVar32[9] = (char)((ulong)uVar70 >> 0x20);
    auVar32._0_9_ = SUB169((undefined1  [16])0x0,0);
    auVar32._10_2_ = auVar29._10_2_;
    auVar36._9_3_ = auVar32._9_3_;
    auVar36._0_9_ = (unkuint9)0;
    auVar21._1_10_ =
         SUB1610(ZEXT516(CONCAT41(auVar36._8_4_,(char)((ulong)uVar70 >> 0x18))) << 0x38,6);
    auVar21[0] = (char)((ulong)uVar70 >> 0x10);
    auVar21._11_5_ = 0;
    auVar20._1_12_ = SUB1612(auVar21 << 0x28,4);
    auVar20[0] = (char)((ulong)uVar70 >> 8);
    auVar20._13_3_ = 0;
    auVar73._1_14_ = SUB1614(auVar20 << 0x18,2);
    auVar73[0] = (char)uVar70;
    auVar73[0xf] = 0;
    auVar58 = pmulhuw(auVar73 << 8,auVar40);
    auVar59._0_2_ = auVar58._0_2_ + auVar65._0_2_ + -0x379a;
    auVar59._2_2_ = auVar58._2_2_ + auVar65._2_2_ + -0x379a;
    auVar59._4_2_ = auVar58._4_2_ + auVar65._4_2_ + -0x379a;
    auVar59._6_2_ = auVar58._6_2_ + auVar65._6_2_ + -0x379a;
    auVar59._8_2_ = auVar58._8_2_ + auVar65._8_2_ + -0x379a;
    auVar59._10_2_ = auVar58._10_2_ + auVar65._10_2_ + -0x379a;
    auVar59._12_2_ = auVar58._12_2_ + auVar65._12_2_ + -0x379a;
    auVar59._14_2_ = auVar58._14_2_ + auVar65._14_2_ + -0x379a;
    auVar75 = pmulhuw(auVar60 << 8,auVar41);
    auVar73 = pmulhuw(auVar73 << 8,auVar42);
    auVar58 = pmulhuw(auVar60 << 8,auVar43);
    auVar58 = paddusw(auVar58,auVar65);
    auVar66._0_2_ = (auVar65._0_2_ - (auVar73._0_2_ + auVar75._0_2_)) + 0x2204;
    auVar66._2_2_ = (auVar65._2_2_ - (auVar73._2_2_ + auVar75._2_2_)) + 0x2204;
    auVar66._4_2_ = (auVar65._4_2_ - (auVar73._4_2_ + auVar75._4_2_)) + 0x2204;
    auVar66._6_2_ = (auVar65._6_2_ - (auVar73._6_2_ + auVar75._6_2_)) + 0x2204;
    auVar66._8_2_ = (auVar65._8_2_ - (auVar73._8_2_ + auVar75._8_2_)) + 0x2204;
    auVar66._10_2_ = (auVar65._10_2_ - (auVar73._10_2_ + auVar75._10_2_)) + 0x2204;
    auVar66._12_2_ = (auVar65._12_2_ - (auVar73._12_2_ + auVar75._12_2_)) + 0x2204;
    auVar66._14_2_ = (auVar65._14_2_ - (auVar73._14_2_ + auVar75._14_2_)) + 0x2204;
    auVar58 = psubusw(auVar58,auVar44);
    auVar60 = psraw(auVar59,6);
    auVar73 = psraw(auVar66,6);
    sVar15 = auVar73._0_2_;
    cVar2 = (0 < sVar15) * (sVar15 < 0x100) * auVar73[0] - (0xff < sVar15);
    uVar67 = CONCAT11(cVar2,0xff);
    sVar15 = auVar73._2_2_;
    cVar3 = (0 < sVar15) * (sVar15 < 0x100) * auVar73[2] - (0xff < sVar15);
    uVar25 = CONCAT12(cVar3,uVar67);
    sVar15 = auVar73._4_2_;
    cVar4 = (0 < sVar15) * (sVar15 < 0x100) * auVar73[4] - (0xff < sVar15);
    uVar68 = CONCAT13(cVar4,uVar25);
    sVar15 = auVar73._6_2_;
    cVar5 = (0 < sVar15) * (sVar15 < 0x100) * auVar73[6] - (0xff < sVar15);
    uVar33 = CONCAT14(cVar5,uVar68);
    auVar37._5_7_ = 0;
    auVar37._0_5_ = uVar33;
    sVar15 = auVar73._8_2_;
    cVar6 = (0 < sVar15) * (sVar15 < 0x100) * auVar73[8] - (0xff < sVar15);
    uVar69 = CONCAT15(cVar6,uVar33);
    sVar15 = auVar73._10_2_;
    cVar7 = (0 < sVar15) * (sVar15 < 0x100) * auVar73[10] - (0xff < sVar15);
    auVar38[6] = cVar7;
    auVar38._0_6_ = uVar69;
    auVar38._7_7_ = 0;
    sVar16 = auVar73._12_2_;
    sVar17 = auVar73._14_2_;
    uVar46 = auVar58._0_2_ >> 6;
    uVar51 = auVar58._2_2_ >> 6;
    uVar52 = auVar58._4_2_ >> 6;
    uVar53 = auVar58._6_2_ >> 6;
    uVar54 = auVar58._8_2_ >> 6;
    uVar55 = auVar58._10_2_ >> 6;
    uVar56 = auVar58._12_2_ >> 6;
    uVar57 = auVar58._14_2_ >> 6;
    sVar15 = auVar60._0_2_;
    sVar8 = auVar60._2_2_;
    sVar9 = auVar60._4_2_;
    sVar10 = auVar60._6_2_;
    sVar11 = auVar60._8_2_;
    sVar12 = auVar60._10_2_;
    sVar13 = auVar60._12_2_;
    sVar14 = auVar60._14_2_;
    auVar50[0xe] = 0xff;
    auVar50._0_14_ = auVar38 << 0x38;
    auVar50[0xf] = (0 < sVar14) * (sVar14 < 0x100) * auVar60[0xe] - (0xff < sVar14);
    auVar49._13_3_ =
         (undefined3)
         (CONCAT27(auVar50._14_2_,
                   CONCAT16((0 < sVar13) * (sVar13 < 0x100) * auVar60[0xc] - (0xff < sVar13),uVar69)
                  ) >> 0x30);
    auVar49[0xc] = 0xff;
    auVar49._0_12_ = auVar37 << 0x38;
    auVar48._11_5_ =
         (undefined5)
         (CONCAT45(auVar49._12_4_,
                   CONCAT14((0 < sVar12) * (sVar12 < 0x100) * auVar60[10] - (0xff < sVar12),uVar68))
         >> 0x20);
    auVar48[10] = 0xff;
    auVar48._0_10_ = (unkuint10)uVar25 << 0x38;
    Var26 = CONCAT72((int7)(CONCAT63(auVar48._10_6_,
                                     CONCAT12((0 < sVar11) * (sVar11 < 0x100) * auVar60[8] -
                                              (0xff < sVar11),uVar67)) >> 0x10),0xffff);
    Var24 = CONCAT91(CONCAT81((long)((unkuint9)Var26 >> 8),
                              (0 < sVar10) * (sVar10 < 0x100) * auVar60[6] - (0xff < sVar10)),0xff);
    auVar23._2_10_ = Var24;
    auVar23[1] = (0 < sVar9) * (sVar9 < 0x100) * auVar60[4] - (0xff < sVar9);
    auVar23[0] = 0xff;
    auVar22._2_12_ = auVar23;
    auVar22[1] = (0 < sVar8) * (sVar8 < 0x100) * auVar60[2] - (0xff < sVar8);
    auVar22[0] = 0xff;
    auVar47._0_2_ = CONCAT11((0 < sVar15) * (sVar15 < 0x100) * auVar60[0] - (0xff < sVar15),0xff);
    auVar47._2_14_ = auVar22;
    uVar67 = CONCAT11((uVar46 != 0) * (uVar46 < 0x100) * (char)uVar46 - (0xff < uVar46),cVar2);
    uVar68 = CONCAT13((uVar51 != 0) * (uVar51 < 0x100) * (char)uVar51 - (0xff < uVar51),
                      CONCAT12(cVar3,uVar67));
    uVar69 = CONCAT15((uVar52 != 0) * (uVar52 < 0x100) * (char)uVar52 - (0xff < uVar52),
                      CONCAT14(cVar4,uVar68));
    uVar70 = CONCAT17((uVar53 != 0) * (uVar53 < 0x100) * (char)uVar53 - (0xff < uVar53),
                      CONCAT16(cVar5,uVar69));
    auVar71._0_10_ =
         CONCAT19((uVar54 != 0) * (uVar54 < 0x100) * (char)uVar54 - (0xff < uVar54),
                  CONCAT18(cVar6,uVar70));
    auVar71[10] = cVar7;
    auVar71[0xb] = (uVar55 != 0) * (uVar55 < 0x100) * (char)uVar55 - (0xff < uVar55);
    auVar72[0xc] = (0 < sVar16) * (sVar16 < 0x100) * auVar73[0xc] - (0xff < sVar16);
    auVar72._0_12_ = auVar71;
    auVar72[0xd] = (uVar56 != 0) * (uVar56 < 0x100) * (char)uVar56 - (0xff < uVar56);
    auVar74[0xe] = (0 < sVar17) * (sVar17 < 0x100) * auVar73[0xe] - (0xff < sVar17);
    auVar74._0_14_ = auVar72;
    auVar74[0xf] = (uVar57 != 0) * (uVar57 < 0x100) * (char)uVar57 - (0xff < uVar57);
    auVar64._0_12_ = auVar47._0_12_;
    auVar64._12_2_ = (short)Var24;
    auVar64._14_2_ = (short)((ulong)uVar70 >> 0x30);
    auVar63._12_4_ = auVar64._12_4_;
    auVar63._0_10_ = auVar47._0_10_;
    auVar63._10_2_ = (short)((uint6)uVar69 >> 0x20);
    auVar62._10_6_ = auVar63._10_6_;
    auVar62._0_8_ = auVar47._0_8_;
    auVar62._8_2_ = auVar23._0_2_;
    auVar61._8_8_ = auVar62._8_8_;
    auVar61._6_2_ = (short)((uint)uVar68 >> 0x10);
    auVar61._4_2_ = auVar22._0_2_;
    auVar61._2_2_ = uVar67;
    auVar61._0_2_ = auVar47._0_2_;
    *(undefined1 (*) [16])(dst + uVar45 * 4 + 0x20) = auVar61;
    puVar1 = dst + uVar45 * 4 + 0x30;
    *(short *)puVar1 = (short)((unkuint9)Var26 >> 8);
    *(short *)(puVar1 + 2) = (short)((unkuint10)auVar71._0_10_ >> 0x40);
    *(short *)(puVar1 + 4) = auVar48._10_2_;
    *(short *)(puVar1 + 6) = auVar71._10_2_;
    *(short *)(puVar1 + 8) = auVar49._12_2_;
    *(short *)(puVar1 + 10) = auVar72._12_2_;
    *(short *)(puVar1 + 0xc) = auVar50._14_2_;
    *(short *)(puVar1 + 0xe) = auVar74._14_2_;
    uVar45 = uVar45 + 8;
  } while (uVar45 < 0x18);
  return;
}

Assistant:

void VP8YuvToArgb32_SSE2(const uint8_t* y, const uint8_t* u, const uint8_t* v,
                         uint8_t* dst) {
  const __m128i kAlpha = _mm_set1_epi16(255);
  int n;
  for (n = 0; n < 32; n += 8, dst += 32) {
    __m128i R, G, B;
    YUV444ToRGB_SSE2(y + n, u + n, v + n, &R, &G, &B);
    PackAndStore4_SSE2(&kAlpha, &R, &G, &B, dst);
  }
}